

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O2

int32_t __thiscall
icu_63::BMPSet::spanBackUTF8(BMPSet *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  UBool UVar1;
  uint c;
  undefined8 in_RAX;
  byte bVar2;
  uint uVar3;
  int32_t hi;
  uint uVar4;
  int32_t lo;
  long lVar5;
  int iVar6;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    lVar5 = (long)length;
    iVar6 = length + -1;
    uStack_38 = CONCAT44(iVar6,(undefined4)uStack_38);
    bVar2 = s[lVar5 + -1];
    if (-1 < (char)bVar2) {
      if (spanCondition == USET_SPAN_NOT_CONTAINED) {
        do {
          if (this->latin1Contains[bVar2] != '\0') {
            return length;
          }
          if (lVar5 == 1) {
            return 0;
          }
          uStack_38 = CONCAT44(length + -2,(undefined4)uStack_38);
          bVar2 = s[lVar5 + -2];
          length = length + -1;
          lVar5 = lVar5 + -1;
        } while (-1 < (char)bVar2);
      }
      else {
        lVar5 = (long)length;
        do {
          if (this->latin1Contains[bVar2] == '\0') {
            return length;
          }
          if (lVar5 == 1) {
            return 0;
          }
          uStack_38 = CONCAT44(length + -2,(undefined4)uStack_38);
          bVar2 = s[lVar5 + -2];
          length = length + -1;
          lVar5 = lVar5 + -1;
        } while (-1 < (char)bVar2);
      }
      iVar6 = length + -1;
    }
    c = utf8_prevCharSafeBody_63(s,0,(int32_t *)((long)&uStack_38 + 4),(uint)bVar2,-3);
    if ((int)c < 0x800) {
      if ((((byte)(this->table7FF[c & 0x3f] >> ((byte)(c >> 6) & 0x1f)) ^
           spanCondition != USET_SPAN_NOT_CONTAINED) & 1) != 0) goto LAB_002ce243;
    }
    else {
      if (c < 0x10000) {
        uVar3 = c >> 0xc;
        uVar4 = *(uint *)((long)this->bmpBlockBits + (ulong)(c >> 4 & 0xfc)) >> ((byte)uVar3 & 0x1f)
                & 0x10001;
        if (1 < uVar4) {
          lo = this->list4kStarts[uVar3];
          hi = this->list4kStarts[(ulong)uVar3 + 1];
          goto LAB_002ce214;
        }
      }
      else {
        lo = this->list4kStarts[0x10];
        hi = this->list4kStarts[0x11];
LAB_002ce214:
        UVar1 = containsSlow(this,c,lo,hi);
        uVar4 = (uint)UVar1;
      }
      if (uVar4 != (spanCondition != USET_SPAN_NOT_CONTAINED)) {
LAB_002ce243:
        return iVar6 + 1;
      }
    }
    length = uStack_38._4_4_;
    if (uStack_38._4_4_ < 1) {
      return 0;
    }
  } while( true );
}

Assistant:

int32_t
BMPSet::spanBackUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    uint8_t b;

    do {
        b=s[--length];
        if(U8_IS_SINGLE(b)) {
            // ASCII sub-span
            if(spanCondition) {
                do {
                    if(!latin1Contains[b]) {
                        return length+1;
                    } else if(length==0) {
                        return 0;
                    }
                    b=s[--length];
                } while(U8_IS_SINGLE(b));
            } else {
                do {
                    if(latin1Contains[b]) {
                        return length+1;
                    } else if(length==0) {
                        return 0;
                    }
                    b=s[--length];
                } while(U8_IS_SINGLE(b));
            }
        }

        int32_t prev=length;
        UChar32 c;
        // trail byte: collect a multi-byte character
        // (or  lead byte in last-trail position)
        c=utf8_prevCharSafeBody(s, 0, &length, b, -3);
        // c is a valid code point, not ASCII, not a surrogate
        if(c<=0x7ff) {
            if((USetSpanCondition)((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0) != spanCondition) {
                return prev+1;
            }
        } else if(c<=0xffff) {
            int lead=c>>12;
            uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
            if(twoBits<=1) {
                // All 64 code points with the same bits 15..6
                // are either in the set or not.
                if(twoBits!=(uint32_t)spanCondition) {
                    return prev+1;
                }
            } else {
                // Look up the code point in its 4k block of code points.
                if(containsSlow(c, list4kStarts[lead], list4kStarts[lead+1]) != spanCondition) {
                    return prev+1;
                }
            }
        } else {
            if(containsSlow(c, list4kStarts[0x10], list4kStarts[0x11]) != spanCondition) {
                return prev+1;
            }
        }
    } while(length>0);
    return 0;
}